

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintDouble
          (FastFieldValuePrinter *this,double val,BaseTextGenerator *generator)

{
  allocator<char> local_31;
  double local_30;
  string local_28;
  
  local_30 = val;
  if (NAN(val)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"nan",&local_31);
  }
  else {
    io::SimpleDtoa_abi_cxx11_(&local_28,(io *)generator,val);
  }
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_28._M_dataplus._M_p,local_28._M_string_length);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintDouble(
    double val, BaseTextGenerator* generator) const {
  generator->PrintString(!std::isnan(val) ? io::SimpleDtoa(val) : "nan");
}